

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O1

void __thiscall QLocalServerPrivate::setError(QLocalServerPrivate *this,QString *function)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  SocketError SVar4;
  uint *puVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QArrayData *local_78 [3];
  QArrayData *local_60 [3];
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (uint *)__errno_location();
  uVar6 = (ulong)*puVar5;
  if (uVar6 < 0x29) {
    if ((0x11040100004U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0xb) goto LAB_00246541;
      if (uVar6 != 0xd) goto LAB_00246640;
      QMetaObject::tr((char *)local_60,(char *)&QLocalServer::staticMetaObject,0x282253);
      QVar8.m_size = (size_t)local_60;
      QVar8.field_0.m_data = &local_48;
      QString::arg_impl(QVar8,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
      pQVar1 = &((this->errorString).d.d)->super_QArrayData;
      pcVar2 = (this->errorString).d.ptr;
      (this->errorString).d.d = (Data *)local_48;
      (this->errorString).d.ptr = pcStack_40;
      qVar3 = (this->errorString).d.size;
      (this->errorString).d.size = local_38;
      local_48 = pQVar1;
      pcStack_40 = pcVar2;
      local_38 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      SVar4 = SocketAccessError;
    }
    else {
      QMetaObject::tr((char *)local_60,(char *)&QLocalServer::staticMetaObject,0x2819e5);
      QVar7.m_size = (size_t)local_60;
      QVar7.field_0.m_data = &local_48;
      QString::arg_impl(QVar7,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
      pQVar1 = &((this->errorString).d.d)->super_QArrayData;
      pcVar2 = (this->errorString).d.ptr;
      (this->errorString).d.d = (Data *)local_48;
      (this->errorString).d.ptr = pcStack_40;
      qVar3 = (this->errorString).d.size;
      (this->errorString).d.size = local_38;
      local_48 = pQVar1;
      pcStack_40 = pcVar2;
      local_38 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      SVar4 = HostNotFoundError;
    }
  }
  else {
LAB_00246640:
    if (*puVar5 == 0x62) {
      QMetaObject::tr((char *)local_60,(char *)&QLocalServer::staticMetaObject,0x282269);
      QVar9.m_size = (size_t)local_60;
      QVar9.field_0.m_data = &local_48;
      QString::arg_impl(QVar9,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
      pQVar1 = &((this->errorString).d.d)->super_QArrayData;
      pcVar2 = (this->errorString).d.ptr;
      (this->errorString).d.d = (Data *)local_48;
      (this->errorString).d.ptr = pcStack_40;
      qVar3 = (this->errorString).d.size;
      (this->errorString).d.size = local_38;
      local_48 = pQVar1;
      pcStack_40 = pcVar2;
      local_38 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      SVar4 = AddressInUseError;
    }
    else {
      QMetaObject::tr((char *)local_78,(char *)&QLocalServer::staticMetaObject,0x28227c);
      QVar10.m_size = (size_t)local_78;
      QVar10.field_0.m_data = local_60;
      QString::arg_impl(QVar10,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
      QString::arg_impl((longlong)&local_48,(int)local_60,*puVar5,(QChar)0x0);
      pQVar1 = &((this->errorString).d.d)->super_QArrayData;
      pcVar2 = (this->errorString).d.ptr;
      (this->errorString).d.d = (Data *)local_48;
      (this->errorString).d.ptr = pcStack_40;
      qVar3 = (this->errorString).d.size;
      (this->errorString).d.size = local_38;
      local_48 = pQVar1;
      pcStack_40 = pcVar2;
      local_38 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      if (local_78[0] != (QArrayData *)0x0) {
        LOCK();
        (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78[0],2,0x10);
        }
      }
      SVar4 = UnknownSocketError;
    }
  }
  this->error = SVar4;
LAB_00246541:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalServerPrivate::setError(const QString &function)
{
    if (EAGAIN == errno)
        return;

    switch (errno) {
    case EACCES:
        errorString = QLocalServer::tr("%1: Permission denied").arg(function);
        error = QAbstractSocket::SocketAccessError;
        break;
    case ELOOP:
    case ENOENT:
    case ENAMETOOLONG:
    case EROFS:
    case ENOTDIR:
        errorString = QLocalServer::tr("%1: Name error").arg(function);
        error = QAbstractSocket::HostNotFoundError;
        break;
    case EADDRINUSE:
        errorString = QLocalServer::tr("%1: Address in use").arg(function);
        error = QAbstractSocket::AddressInUseError;
        break;

    default:
        errorString = QLocalServer::tr("%1: Unknown error %2")
                      .arg(function).arg(errno);
        error = QAbstractSocket::UnknownSocketError;
#if defined QLOCALSERVER_DEBUG
        qWarning() << errorString << "fullServerName:" << fullServerName;
#endif
    }
}